

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O2

void __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::deadline_timer_service
          (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,io_context *io_context)

{
  epoll_reactor *this_00;
  
  (this->timer_queue_).super_timer_queue_base.next_ = (timer_queue_base *)0x0;
  (this->timer_queue_).super_timer_queue_base._vptr_timer_queue_base =
       (_func_int **)&PTR__timer_queue_001c5160;
  (this->timer_queue_).timers_ = (per_timer_data *)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timer_queue_).heap_.
  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = use_service<asio::detail::epoll_reactor>(io_context);
  this->scheduler_ = this_00;
  epoll_reactor::init_task(this_00);
  epoll_reactor::do_add_timer_queue(this->scheduler_,(timer_queue_base *)this);
  return;
}

Assistant:

deadline_timer_service(asio::io_context& io_context)
    : scheduler_(asio::use_service<timer_scheduler>(io_context))
  {
    scheduler_.init_task();
    scheduler_.add_timer_queue(timer_queue_);
  }